

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiAnalyzerResults.cpp
# Opt level: O3

void __thiscall
MidiAnalyzerResults::GenerateBubbleText
          (MidiAnalyzerResults *this,U64 frame_index,Channel *channel,DisplayBase display_base)

{
  Frame frame;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  stash sStack_30;
  undefined2 local_28;
  
  AnalyzerResults::ClearResultStrings();
  AnalyzerResults::GetFrame((ulonglong)&local_48);
  this->localDisplay_base = display_base;
  *(undefined8 *)&this->localFrame = local_48;
  *(undefined8 *)&this->field_0x28 = uStack_40;
  *(undefined8 *)&this->field_0x30 = local_38;
  *(stash *)&this->field_0x38 = sStack_30;
  *(undefined2 *)&this->field_0x40 = local_28;
  this->localFrame_index = frame_index;
  results(this,(uint)(byte)local_28,sStack_30);
  Frame::~Frame((Frame *)&local_48);
  return;
}

Assistant:

void MidiAnalyzerResults::GenerateBubbleText( U64 frame_index, Channel& channel, DisplayBase display_base )
{
    ClearResultStrings();
    Frame frame = GetFrame( frame_index );

    enum MidiFrameType FrameType;
    union stash stash1;
    FrameType = ( enum MidiFrameType )frame.mType;
    stash1.mData2 = frame.mData2;

    localDisplay_base = display_base;
    localFrame = frame;
    localFrame_index = frame_index;


    results( FrameType, stash1 );
}